

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_HPKE_Curve51_CP32_SHA256.c
# Opt level: O2

uint32_t Hacl_HPKE_Curve51_CP32_SHA256_openBase
                   (uint8_t *pkE,uint8_t *skR,uint32_t infolen,uint8_t *info,uint32_t aadlen,
                   uint8_t *aad,uint32_t ctlen,uint8_t *ct,uint8_t *o_pt)

{
  Hacl_Impl_HPKE_context_s o_ctx_00;
  ushort uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint64_t ctx_seq;
  uint8_t ctx_nonce [12];
  Hacl_Impl_HPKE_context_s o_ctx;
  uint8_t local_64 [4];
  ulong local_60;
  uint8_t ctx_key [32];
  uint8_t ctx_exporter [32];
  
  ctx_nonce[8] = '\0';
  ctx_nonce[9] = '\0';
  ctx_nonce[10] = '\0';
  ctx_nonce[0xb] = '\0';
  ctx_key[0x10] = '\0';
  ctx_key[0x11] = '\0';
  ctx_key[0x12] = '\0';
  ctx_key[0x13] = '\0';
  ctx_key[0x14] = '\0';
  ctx_key[0x15] = '\0';
  ctx_key[0x16] = '\0';
  ctx_key[0x17] = '\0';
  ctx_key[0x18] = '\0';
  ctx_key[0x19] = '\0';
  ctx_key[0x1a] = '\0';
  ctx_key[0x1b] = '\0';
  ctx_key[0x1c] = '\0';
  ctx_key[0x1d] = '\0';
  ctx_key[0x1e] = '\0';
  ctx_key[0x1f] = '\0';
  ctx_nonce[0] = '\0';
  ctx_nonce[1] = '\0';
  ctx_nonce[2] = '\0';
  ctx_nonce[3] = '\0';
  ctx_nonce[4] = '\0';
  ctx_nonce[5] = '\0';
  ctx_nonce[6] = '\0';
  ctx_nonce[7] = '\0';
  ctx_seq = 0;
  ctx_key[0] = '\0';
  ctx_key[1] = '\0';
  ctx_key[2] = '\0';
  ctx_key[3] = '\0';
  ctx_key[4] = '\0';
  ctx_key[5] = '\0';
  ctx_key[6] = '\0';
  ctx_key[7] = '\0';
  ctx_key[8] = '\0';
  ctx_key[9] = '\0';
  ctx_key[10] = '\0';
  ctx_key[0xb] = '\0';
  ctx_key[0xc] = '\0';
  ctx_key[0xd] = '\0';
  ctx_key[0xe] = '\0';
  ctx_key[0xf] = '\0';
  ctx_exporter[0x10] = '\0';
  ctx_exporter[0x11] = '\0';
  ctx_exporter[0x12] = '\0';
  ctx_exporter[0x13] = '\0';
  ctx_exporter[0x14] = '\0';
  ctx_exporter[0x15] = '\0';
  ctx_exporter[0x16] = '\0';
  ctx_exporter[0x17] = '\0';
  ctx_exporter[0x18] = '\0';
  ctx_exporter[0x19] = '\0';
  ctx_exporter[0x1a] = '\0';
  ctx_exporter[0x1b] = '\0';
  ctx_exporter[0x1c] = '\0';
  ctx_exporter[0x1d] = '\0';
  ctx_exporter[0x1e] = '\0';
  ctx_exporter[0x1f] = '\0';
  ctx_exporter[0] = '\0';
  ctx_exporter[1] = '\0';
  ctx_exporter[2] = '\0';
  ctx_exporter[3] = '\0';
  ctx_exporter[4] = '\0';
  ctx_exporter[5] = '\0';
  ctx_exporter[6] = '\0';
  ctx_exporter[7] = '\0';
  ctx_exporter[8] = '\0';
  ctx_exporter[9] = '\0';
  ctx_exporter[10] = '\0';
  ctx_exporter[0xb] = '\0';
  ctx_exporter[0xc] = '\0';
  ctx_exporter[0xd] = '\0';
  ctx_exporter[0xe] = '\0';
  ctx_exporter[0xf] = '\0';
  o_ctx_00.ctx_nonce = ctx_nonce;
  o_ctx_00.ctx_key = ctx_key;
  o_ctx_00.ctx_seq = &ctx_seq;
  o_ctx_00.ctx_exporter = ctx_exporter;
  uVar2 = Hacl_HPKE_Curve51_CP32_SHA256_setupBaseR(o_ctx_00,pkE,skR,infolen,info);
  if (uVar2 == 0) {
    uVar1 = (ushort)(ctx_seq >> 8);
    local_64[0] = ctx_nonce[0];
    local_64[1] = ctx_nonce[1];
    local_64[2] = ctx_nonce[2];
    local_64[3] = ctx_nonce[3];
    local_60 = CONCAT44(ctx_nonce._8_4_,ctx_nonce._4_4_) ^
               (ctx_seq >> 0x38 | (ctx_seq & 0xff000000000000) >> 0x28 |
                (ctx_seq & 0xff0000000000) >> 0x18 | (ctx_seq & 0xff00000000) >> 8 |
                (ulong)((ushort)(ctx_seq >> 0x18) & 0xff | uVar1 & 0xff00) << 0x20 |
               (ulong)(ushort)((ushort)(byte)ctx_seq << 8 | uVar1 & 0xff) << 0x30);
    uVar2 = Hacl_AEAD_Chacha20Poly1305_decrypt
                      (o_pt,ct,ctlen - 0x10,aad,aadlen,ctx_key,local_64,ct + ((ulong)ctlen - 0x10));
    uVar3 = (uint)(ctx_seq == 0xffffffffffffffff || uVar2 != 0);
  }
  else {
    uVar3 = 1;
  }
  return uVar3;
}

Assistant:

uint32_t
Hacl_HPKE_Curve51_CP32_SHA256_openBase(
  uint8_t *pkE,
  uint8_t *skR,
  uint32_t infolen,
  uint8_t *info,
  uint32_t aadlen,
  uint8_t *aad,
  uint32_t ctlen,
  uint8_t *ct,
  uint8_t *o_pt
)
{
  uint8_t ctx_key[32U] = { 0U };
  uint8_t ctx_nonce[12U] = { 0U };
  uint64_t ctx_seq = 0ULL;
  uint8_t ctx_exporter[32U] = { 0U };
  Hacl_Impl_HPKE_context_s
  o_ctx =
    {
      .ctx_key = ctx_key,
      .ctx_nonce = ctx_nonce,
      .ctx_seq = &ctx_seq,
      .ctx_exporter = ctx_exporter
    };
  uint32_t res = Hacl_HPKE_Curve51_CP32_SHA256_setupBaseR(o_ctx, pkE, skR, infolen, info);
  if (res == 0U)
  {
    uint8_t nonce[12U] = { 0U };
    uint64_t s = o_ctx.ctx_seq[0U];
    uint8_t enc[12U] = { 0U };
    store64_be(enc + 4U, s);
    KRML_MAYBE_FOR12(i,
      0U,
      12U,
      1U,
      uint8_t xi = enc[i];
      uint8_t yi = o_ctx.ctx_nonce[i];
      nonce[i] = (uint32_t)xi ^ (uint32_t)yi;);
    uint8_t *cipher = ct;
    uint8_t *tag = ct + ctlen - 16U;
    uint32_t
    res1 =
      Hacl_AEAD_Chacha20Poly1305_decrypt(o_pt,
        cipher,
        ctlen - 16U,
        aad,
        aadlen,
        o_ctx.ctx_key,
        nonce,
        tag);
    if (res1 == 0U)
    {
      uint64_t s1 = o_ctx.ctx_seq[0U];
      if (s1 == 18446744073709551615ULL)
      {
        return 1U;
      }
      uint64_t s_ = s1 + 1ULL;
      o_ctx.ctx_seq[0U] = s_;
      return 0U;
    }
    return 1U;
  }
  return 1U;
}